

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

string * __thiscall
cmGlobalGenerator::SelectMakeProgram
          (string *__return_storage_ptr__,cmGlobalGenerator *this,string *inMakeProgram,
          string *makeDefault)

{
  cmake *this_00;
  bool bVar1;
  string_view value;
  string_view value_00;
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)inMakeProgram);
  value._M_str = (__return_storage_ptr__->_M_dataplus)._M_p;
  value._M_len = __return_storage_ptr__->_M_string_length;
  bVar1 = cmValue::IsOff(value);
  if (bVar1) {
    this_00 = this->CMakeInstance;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"CMAKE_MAKE_PROGRAM",&local_39);
    cmake::GetCacheDefinition(this_00,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    cmIsOff((cmValue)0x212bca);
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
    value_00._M_str = (__return_storage_ptr__->_M_dataplus)._M_p;
    value_00._M_len = __return_storage_ptr__->_M_string_length;
    bVar1 = cmValue::IsOff(value_00);
    if ((bVar1) && (__return_storage_ptr__->_M_string_length != 0)) {
      std::__cxx11::string::assign((char *)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalGenerator::SelectMakeProgram(
  const std::string& inMakeProgram, const std::string& makeDefault) const
{
  std::string makeProgram = inMakeProgram;
  if (cmIsOff(makeProgram)) {
    cmValue makeProgramCSTR =
      this->CMakeInstance->GetCacheDefinition("CMAKE_MAKE_PROGRAM");
    if (cmIsOff(makeProgramCSTR)) {
      makeProgram = makeDefault;
    } else {
      makeProgram = *makeProgramCSTR;
    }
    if (cmIsOff(makeProgram) && !makeProgram.empty()) {
      makeProgram = "CMAKE_MAKE_PROGRAM-NOTFOUND";
    }
  }
  return makeProgram;
}